

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolb.c
# Opt level: O0

int ffpclb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          uchar *array,int *status)

{
  int iVar1;
  char *pcVar2;
  uint in_ESI;
  long in_R8;
  FITSfile *in_R9;
  fitsfile *in_stack_00000008;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  size_t formlen;
  char message [81];
  char cform [20];
  char tform [20];
  double zero;
  double scale;
  LONGLONG maxelem;
  LONGLONG tnull;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG wrtptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long ntodo;
  long incre;
  long twidth;
  int writeraw;
  int hdutype;
  int maxelem2;
  int tcode;
  int writemode;
  double *values;
  double *status_00;
  int *status_01;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  int *cform_00;
  long *zero_00;
  long *input;
  long *ntodo_00;
  long *status_02;
  long *buffer_00;
  int *status_03;
  undefined1 *buffer_01;
  undefined1 *gsize;
  fitsfile *fptr_02;
  long local_7280;
  long local_7278;
  double *output;
  double in_stack_ffffffffffff8dc8;
  LONGLONG in_stack_ffffffffffff8dd0;
  LONGLONG in_stack_ffffffffffff8dd8;
  int in_stack_ffffffffffff8de4;
  fitsfile *in_stack_ffffffffffff8de8;
  double *in_stack_ffffffffffff8e00;
  double *in_stack_ffffffffffff8e08;
  char *in_stack_ffffffffffff8e10;
  long *in_stack_ffffffffffff8e18;
  int *in_stack_ffffffffffff8e20;
  int *in_stack_ffffffffffff8e28;
  LONGLONG *in_stack_ffffffffffff8e30;
  LONGLONG *in_stack_ffffffffffff8e38;
  long *in_stack_ffffffffffff8e40;
  LONGLONG *in_stack_ffffffffffff8e48;
  LONGLONG *in_stack_ffffffffffff8e50;
  int *in_stack_ffffffffffff8e58;
  LONGLONG *in_stack_ffffffffffff8e60;
  char *in_stack_ffffffffffff8e68;
  int *in_stack_ffffffffffff8e70;
  undefined1 local_1b8 [24];
  ulong local_1a0;
  char local_198 [95];
  char acStack_139 [33];
  int local_118 [8];
  double local_f8;
  double local_f0;
  long local_e8;
  undefined1 local_e0 [8];
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  fitsfile local_88;
  int local_78;
  int local_74;
  fitsfile local_70;
  long local_60;
  uint local_44;
  int local_34;
  
  if (in_stack_00000008->HDUposition < 1) {
    output = (double *)&stack0xffffffffffff8dc8;
    local_70._4_4_ = 0x11;
    status_01 = local_118;
    gsize = local_1b8;
    values = &local_f0;
    status_00 = &local_f8;
    fptr_00 = &local_88;
    fptr_01 = &local_70;
    cform_00 = &local_74;
    zero_00 = &local_a8;
    input = &local_b0;
    ntodo_00 = &local_90;
    status_02 = &local_a0;
    buffer_00 = &local_c0;
    status_03 = &local_78;
    buffer_01 = local_e0;
    fptr_02 = in_stack_00000008;
    local_70.Fptr = in_R9;
    local_60 = in_R8;
    local_44 = in_ESI;
    iVar1 = ffgcprll(in_stack_ffffffffffff8de8,in_stack_ffffffffffff8de4,in_stack_ffffffffffff8dd8,
                     in_stack_ffffffffffff8dd0,(LONGLONG)in_stack_ffffffffffff8dc8,
                     (int)((ulong)output >> 0x20),in_stack_ffffffffffff8e00,
                     in_stack_ffffffffffff8e08,in_stack_ffffffffffff8e10,in_stack_ffffffffffff8e18,
                     in_stack_ffffffffffff8e20,in_stack_ffffffffffff8e28,in_stack_ffffffffffff8e30,
                     in_stack_ffffffffffff8e38,in_stack_ffffffffffff8e40,in_stack_ffffffffffff8e48,
                     in_stack_ffffffffffff8e50,in_stack_ffffffffffff8e58,in_stack_ffffffffffff8e60,
                     in_stack_ffffffffffff8e68,in_stack_ffffffffffff8e70);
    if (iVar1 < 1) {
      local_e8 = (long)local_74;
      if (local_70.HDUposition == 0x10) {
        ffcfmt((char *)fptr_00,(char *)status_01);
      }
      if ((((local_f0 != 1.0) || (NAN(local_f0))) || (local_f8 != 0.0)) ||
         ((NAN(local_f8) || (local_70.HDUposition != 0xb)))) {
        local_88.Fptr._4_4_ = 0;
      }
      else {
        local_88.Fptr._4_4_ = 1;
        if (local_60 < 0x7fffffff) {
          local_e8 = local_60;
        }
        else {
          local_e8 = 0x7fffffff;
        }
      }
      local_d0 = local_60;
      local_d8 = 0;
      local_c8 = 0;
      while (local_d0 != 0) {
        if (local_d0 < local_e8) {
          local_7278 = local_d0;
        }
        else {
          local_7278 = local_e8;
        }
        if (local_7278 < local_a0 - local_b0) {
          local_7280 = local_7278;
        }
        else {
          local_7280 = local_a0 - local_b0;
        }
        local_98 = local_7280;
        local_b8 = local_a8 + local_c8 * local_c0 + local_b0 * local_90;
        ffmbyt(fptr_01,(LONGLONG)fptr_00,(int)((ulong)status_01 >> 0x20),(int *)status_00);
        if (local_70.HDUposition == 0xb) {
          if (local_88.Fptr._4_4_ == 0) {
            ffi1fi1((uchar *)input,(long)zero_00,(double)cform_00,(double)fptr_01,(uchar *)fptr_00,
                    status_01);
            ffpi1b(fptr_00,(long)status_01,(long)status_00,(uchar *)values,(int *)0x20cae4);
          }
          else {
            ffpi1b(fptr_00,(long)status_01,(long)status_00,(uchar *)values,(int *)0x20ca76);
          }
        }
        else if (local_70.HDUposition == 0x10) {
          local_1a0 = strlen(acStack_139 + 1);
          pcVar2 = strchr((char *)local_118,0x41);
          if (pcVar2 == (char *)0x0) {
            if (((local_78 != 1) || (local_1a0 < 2)) ||
               ((acStack_139[local_1a0] != 'f' && (acStack_139[local_1a0] != 'E')))) {
LAB_0020cf13:
              snprintf(local_198,0x51,"Cannot write numbers to column %d which has format %s",
                       (ulong)local_44,local_118);
              ffpmsg((char *)0x20cf4a);
              if (local_78 == 1) {
                in_stack_00000008->HDUposition = 0x137;
                return 0x137;
              }
              in_stack_00000008->HDUposition = 0x138;
              return 0x138;
            }
            ffi1fstr((uchar *)status_02,(long)ntodo_00,(double)input,(double)zero_00,
                     (char *)cform_00,(long)fptr_01,(char *)fptr_00,status_01);
            if (local_90 == local_88._0_8_) {
              ffpbyt(fptr_02,(LONGLONG)gsize,buffer_01,status_03);
            }
            else {
              ffpbytoff(fptr_02,(long)gsize,(long)buffer_01,(long)status_03,buffer_00,
                        (int *)status_02);
            }
          }
          else if (local_90 == local_88._0_8_) {
            ffpbyt(fptr_02,(LONGLONG)gsize,buffer_01,status_03);
          }
          else {
            ffpbytoff(fptr_02,(long)gsize,(long)buffer_01,(long)status_03,buffer_00,(int *)status_02
                     );
          }
        }
        else if (local_70.HDUposition == 0x15) {
          ffi1fi2((uchar *)((long)&(local_70.Fptr)->filehandle + local_d8),local_98,local_f0,
                  local_f8,(short *)output,&in_stack_00000008->HDUposition);
          ffpi2b(fptr_00,(long)status_01,(long)status_00,(short *)values,(int *)0x20cbc6);
        }
        else if (local_70.HDUposition == 0x29) {
          ffi1fi4((uchar *)((long)&(local_70.Fptr)->filehandle + local_d8),local_98,local_f0,
                  local_f8,(int *)output,&in_stack_00000008->HDUposition);
          ffpi4b(fptr_00,(long)status_01,(long)status_00,(int *)values,(int *)0x20cc37);
        }
        else if (local_70.HDUposition == 0x2a) {
          ffi1fr4((uchar *)((long)&(local_70.Fptr)->filehandle + local_d8),local_98,local_f0,
                  local_f8,(float *)output,&in_stack_00000008->HDUposition);
          ffpr4b(fptr_00,(long)status_01,(long)status_00,(float *)values,(int *)0x20cca8);
        }
        else if (local_70.HDUposition == 0x51) {
          ffi1fi8((uchar *)((long)&(local_70.Fptr)->filehandle + local_d8),local_98,local_f0,
                  local_f8,(LONGLONG *)output,&in_stack_00000008->HDUposition);
          ffpi8b(fptr_00,(long)status_01,(long)status_00,(long *)values,(int *)0x20cb55);
        }
        else {
          if (local_70.HDUposition != 0x52) goto LAB_0020cf13;
          ffi1fr8((uchar *)((long)&(local_70.Fptr)->filehandle + local_d8),local_98,local_f0,
                  local_f8,output,&in_stack_00000008->HDUposition);
          ffpr8b(fptr_00,(long)status_01,(long)status_00,values,(int *)0x20cd19);
        }
        if (0 < in_stack_00000008->HDUposition) {
          snprintf(local_198,0x51,
                   "Error writing elements %.0f thru %.0f of input data array (ffpclb).",
                   (double)(local_d8 + 1),(double)(local_d8 + local_98));
          ffpmsg((char *)0x20cfeb);
          return in_stack_00000008->HDUposition;
        }
        local_d0 = local_d0 - local_98;
        if (local_d0 != 0) {
          local_d8 = local_98 + local_d8;
          local_b0 = local_98 + local_b0;
          if (local_b0 == local_a0) {
            local_b0 = 0;
            local_c8 = local_c8 + 1;
          }
        }
      }
      if (in_stack_00000008->HDUposition == -0xb) {
        ffpmsg((char *)0x20d0a9);
        in_stack_00000008->HDUposition = 0x19c;
      }
      local_34 = in_stack_00000008->HDUposition;
    }
    else {
      local_34 = in_stack_00000008->HDUposition;
    }
  }
  else {
    local_34 = in_stack_00000008->HDUposition;
  }
  return local_34;
}

Assistant:

int ffpclb( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            unsigned char *array, /* I - array of values to write           */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table with
  2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    int writemode;
    int tcode, maxelem2, hdutype, writeraw;
    long twidth, incre;
    long  ntodo;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull, maxelem;
    double scale, zero;
    char tform[20], cform[20];
    char message[FLEN_ERRMSG];
    size_t formlen;

    char snull[20];   /*  the FITS null value  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/

    /* IMPORTANT NOTE: that the special case of using this subroutine
       to write bytes to a character column are handled internally
       by the call to ffgcprll() below.  It will adjust the effective
       *tcode, repeats, etc, to appear as a TBYTE column. */

    writemode = 17; /* Equivalent to writemode = 1 but allow TSTRING -> TBYTE */

    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, writemode, &scale, &zero,
        tform, &twidth, &tcode, &maxelem2, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);
    maxelem = maxelem2;

    if (tcode == TSTRING)   
         ffcfmt(tform, cform);     /* derive C format for writing strings */

    /*
      if there is no scaling 
      then we can simply write the raw data bytes into the FITS file if the
      datatype of the FITS column is the same as the input values.  Otherwise,
      we must convert the raw values into the scaled and/or machine dependent
      format in a temporary buffer that has been allocated for this purpose.
    */
    if (scale == 1. && zero == 0. && tcode == TBYTE)
    {
        writeraw = 1;
        if (nelem < (LONGLONG)INT32_MAX) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX;
        }
     }
    else
        writeraw = 0;

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*  First call the ffXXfYY routine to  (1) convert the datatype        */
    /*  if necessary, and (2) scale the values by the FITS TSCALn and      */
    /*  TZEROn linear scaling parameters into a temporary buffer.          */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
        /* limit the number of pixels to process a one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);      
        ntodo = (long) minvalue(ntodo, (repeat - elemnum));

        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);
        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TBYTE):
              if (writeraw)
              {
                /* write raw input bytes without conversion */
                ffpi1b(fptr, ntodo, incre, &array[next], status);
              }
              else
              {
                /* convert the raw data before writing to FITS file */
                ffi1fi1(&array[next], ntodo, scale, zero,
                        (unsigned char *) buffer, status);
                ffpi1b(fptr, ntodo, incre, (unsigned char *) buffer, status);
              }

              break;

            case (TLONGLONG):

                ffi1fi8(&array[next], ntodo, scale, zero,
                        (LONGLONG *) buffer, status);
                ffpi8b(fptr, ntodo, incre, (long *) buffer, status);
                break;

            case (TSHORT):
 
                ffi1fi2(&array[next], ntodo, scale, zero,
                        (short *) buffer, status);
                ffpi2b(fptr, ntodo, incre, (short *) buffer, status);
                break;

            case (TLONG):

                ffi1fi4(&array[next], ntodo, scale, zero,
                        (INT32BIT *) buffer, status);
                ffpi4b(fptr, ntodo, incre, (INT32BIT *) buffer, status);
                break;

            case (TFLOAT):

                ffi1fr4(&array[next], ntodo, scale, zero,
                        (float *)  buffer, status);
                ffpr4b(fptr, ntodo, incre, (float *) buffer, status);
                break;

            case (TDOUBLE):
                ffi1fr8(&array[next], ntodo, scale, zero,
                        (double *) buffer, status);
                ffpr8b(fptr, ntodo, incre, (double *) buffer, status);
                break;

            case (TSTRING):  /* numerical column in an ASCII table */

                formlen = strlen(cform);
	        if (strchr(tform,'A')) 
                {
                    /* write raw input bytes without conversion        */
                    /* This case is a hack to let users write a stream */
                    /* of bytes directly to the 'A' format column      */

		  if (incre == twidth) {
                        ffpbyt(fptr, ntodo, &array[next], status);
		  } else {
                        ffpbytoff(fptr, twidth, ntodo/twidth, incre - twidth, 
                                &array[next], status);
		  }
		  break;
                }
                else if (hdutype == ASCII_TBL && formlen > 1)
                {
                   if (cform[formlen-1] == 'f' || cform[formlen-1] == 'E')
                   {
                     ffi1fstr(&array[next], ntodo, scale, zero, cform,
                             twidth, (char *) buffer, status);

                     if (incre == twidth)    /* contiguous bytes */
                        ffpbyt(fptr, ntodo * twidth, buffer, status);
                     else
                        ffpbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);
                     break;
                   }
                }
                /* can't write to string column, so fall thru to default: */

            default:  /*  error trap  */
                snprintf(message, FLEN_ERRMSG,
                       "Cannot write numbers to column %d which has format %s",
                        colnum,tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
          snprintf(message,FLEN_ERRMSG,
          "Error writing elements %.0f thru %.0f of input data array (ffpclb).",
              (double) (next+1), (double) (next+ntodo));
          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
      ffpmsg(
      "Numerical overflow during type conversion while writing FITS data.");
      *status = NUM_OVERFLOW;
    }

    return(*status);
}